

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O3

Quaternion * __thiscall AML::Quaternion::operator-=(Quaternion *this,Quaternion *rhs)

{
  double dVar1;
  
  dVar1 = (this->field_0).data[1];
  (this->field_0).data[0] = (this->field_0).data[0] - (rhs->field_0).data[0];
  (this->field_0).data[1] = dVar1 - (rhs->field_0).data[1];
  (this->field_0).data[2] = (this->field_0).data[2] - (rhs->field_0).data[2];
  (this->field_0).data[3] = (this->field_0).data[3] - (rhs->field_0).data[3];
  return this;
}

Assistant:

Quaternion& Quaternion::operator-=(const Quaternion& rhs)
    {
        q0 -= rhs.q0;
        q1 -= rhs.q1;
        q2 -= rhs.q2;
        q3 -= rhs.q3;
        return *this;
    }